

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
Liby::TcpServer::initConnection::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,Connection *conn)

{
  TcpServer *pTVar1;
  bool bVar2;
  element_type *this_00;
  undefined1 local_28 [8];
  shared_ptr<Liby::Connection> x;
  Connection *conn_local;
  anon_class_8_1_8991fb9c *this_local;
  
  pTVar1 = this->this;
  x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)conn;
  std::enable_shared_from_this<Liby::Connection>::shared_from_this
            ((enable_shared_from_this<Liby::Connection> *)local_28);
  bVar2 = std::function::operator_cast_to_bool((function *)&pTVar1->erroEventCallback_);
  if (bVar2) {
    std::function<void_(Liby::Connection_&)>::operator()
              (&pTVar1->erroEventCallback_,
               (Connection *)
               x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  this_00 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
  Connection::destroy(this_00);
  std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_28);
  return;
}

Assistant:

void TcpServer::initConnection(Connection &conn) {
    conn.onRead(readEventCallback_).onErro([this](Connection &conn) {
        auto x = conn.shared_from_this();
        if (erroEventCallback_) {
            erroEventCallback_(conn);
        }
        x->destroy();
    });
}